

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::RNEMD::setMomentumFluxVector
          (RNEMD *this,vector<double,_std::allocator<double>_> *momentumFluxVector)

{
  pointer pdVar1;
  long lVar2;
  
  pdVar1 = (momentumFluxVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(momentumFluxVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar2 != 0x18) {
    snprintf(painCave.errMsg,2000,
             "RNEMD: Incorrect number of parameters specified for momentumFluxVector.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,lVar2 >> 3);
    painCave.isFatal = 1;
    simError();
    pdVar1 = (momentumFluxVector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  (this->momentumFluxVector_).super_Vector<double,_3U>.data_[0] = *pdVar1;
  (this->momentumFluxVector_).super_Vector<double,_3U>.data_[1] = pdVar1[1];
  (this->momentumFluxVector_).super_Vector<double,_3U>.data_[2] = pdVar1[2];
  return;
}

Assistant:

void RNEMD::setMomentumFluxVector(
      const std::vector<RealType>& momentumFluxVector) {
    if (momentumFluxVector.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: Incorrect number of parameters specified for "
               "momentumFluxVector.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               momentumFluxVector.size());
      painCave.isFatal = 1;
      simError();
    }

    momentumFluxVector_.x() = momentumFluxVector[0];
    momentumFluxVector_.y() = momentumFluxVector[1];
    momentumFluxVector_.z() = momentumFluxVector[2];
  }